

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O0

Object * __thiscall
punky::eval::Evaluator::eval_program
          (Object *__return_storage_ptr__,Evaluator *this,Environment *env)

{
  bool bVar1;
  pointer this_00;
  StmtNodeVector *this_01;
  type node;
  any *__any;
  Object local_b0;
  reference local_80;
  unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *stmt;
  iterator __end2;
  iterator __begin2;
  StmtNodeVector *__range2;
  Object result;
  Environment *env_local;
  Evaluator *this_local;
  
  __range2._0_4_ = 0;
  result.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._8_8_ = 0;
  result.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._16_8_ = 0;
  result.m_type = Null;
  result._4_4_ = 0;
  result.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._0_8_ = 0;
  result.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._24_8_ = 0;
  result.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._32_8_ = env;
  std::
  variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  ::variant((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
             *)&result);
  this_00 = std::unique_ptr<punky::ast::Program,_std::default_delete<punky::ast::Program>_>::
            operator->(&this->m_program);
  this_01 = ast::Program::statements(this_00);
  __end2 = std::
           vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
           ::begin(this_01);
  stmt = (unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *)
         std::
         vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
         ::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
                                *)&stmt);
    if (!bVar1) {
      obj::Object::Object(__return_storage_ptr__,(Object *)&__range2);
LAB_0012d61e:
      obj::Object::~Object((Object *)&__range2);
      return __return_storage_ptr__;
    }
    local_80 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
               ::operator*(&__end2);
    node = std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>::
           operator*(local_80);
    eval(&local_b0,&node->super_AstNode,
         (Environment *)
         result.m_value.
         super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
         .
         super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         ._32_8_);
    obj::Object::operator=((Object *)&__range2,&local_b0);
    obj::Object::~Object(&local_b0);
    if ((int)__range2 == 3) {
      __any = std::
              get<std::any,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                        ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                          *)&result);
      std::any_cast<punky::obj::Object>(__return_storage_ptr__,__any);
      goto LAB_0012d61e;
    }
    if ((int)__range2 == 4) {
      obj::Object::Object(__return_storage_ptr__,(Object *)&__range2);
      goto LAB_0012d61e;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Object Evaluator::eval_program(env::Environment& env) const
{
    Object result{};
    for (const auto& stmt : m_program->statements())
    {
        result = eval(*stmt, env);

        if (result.m_type == ObjectType::Return)
            return std::any_cast<Object>(std::get<std::any>(result.m_value));

        if (result.m_type == ObjectType::Error)
            return result;
    }
    return result;
}